

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm_info.cc
# Opt level: O3

bool anon_unknown.dwarf_68fb::OutputTracks(Segment *segment,Options *options,FILE *o,Indent *indent)

{
  ProjectionType PVar1;
  pointer pcVar2;
  MasteringMetadata *pMVar3;
  undefined1 *puVar4;
  PrimaryChromaticity *pPVar5;
  bool bVar6;
  int iVar7;
  VideoTrack *this;
  long lVar8;
  _anonymous_namespace_ *p_Var9;
  char *pcVar10;
  uchar *private_data;
  size_t sVar11;
  unsigned_long_long uVar12;
  unsigned_long uVar13;
  ContentEncoding *this_00;
  ContentEncryption *pCVar14;
  PrimaryChromaticity *pPVar15;
  PrimaryChromaticity *pPVar16;
  longlong lVar17;
  Colour *pCVar18;
  Projection *pPVar19;
  longlong lVar20;
  char *str;
  char *str_00;
  uint uVar21;
  VideoTrack *video_track;
  string codec_id;
  wstring codec_name;
  wstring track_name;
  size_t private_size;
  string v_vp9;
  undefined1 *local_190;
  size_t local_188;
  undefined1 local_180 [16];
  PrimaryChromaticity *local_170;
  PrimaryChromaticity *local_168;
  float local_15c;
  PrimaryChromaticity *local_158;
  wstring local_150;
  float local_12c;
  Vp9CodecFeatures local_128;
  PrimaryChromaticity *local_118;
  Tracks *local_110;
  undefined1 *local_108 [2];
  undefined1 local_f8 [20];
  uint local_e4;
  wstring local_e0;
  PrimaryChromaticity *local_c0;
  PrimaryChromaticity *local_b8;
  PrimaryChromaticity *local_b0;
  PrimaryChromaticity *local_a8;
  PrimaryChromaticity *local_a0;
  PrimaryChromaticity *local_98;
  uint local_90 [2];
  undefined1 *local_88;
  size_t local_80;
  undefined1 local_78 [16];
  PrimaryChromaticity *local_68;
  PrimaryChromaticity *local_60;
  Options *local_58;
  unsigned_long local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_110 = mkvparser::Segment::GetTracks(segment);
  if (local_110 == (Tracks *)0x0) {
    _GLOBAL__N_1::OutputTracks();
LAB_00118ec6:
    bVar6 = false;
  }
  else {
    pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length);
    fprintf((FILE *)o,"%sTracks:",local_e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if (options->output_offset == true) {
      fprintf((FILE *)o,"  @: %lld",local_110->m_element_start);
    }
    if (options->output_size == true) {
      fprintf((FILE *)o,"  size: %lld",local_110->m_element_size);
    }
    fputc(10,(FILE *)o);
    local_50 = mkvparser::Tracks::GetTracksCount(local_110);
    if (local_50 != 0) {
      local_98 = (PrimaryChromaticity *)0x7fffffffffffffff;
      local_12c = 3.4028235e+38;
      local_15c = 3.4028235e+38;
      local_48 = 0x7fffffff;
      uStack_44 = 0x7fffffff;
      uStack_40 = 0x7fffffff;
      uStack_3c = 0x7fffffff;
      uVar13 = 0;
      uVar21 = 0;
      local_58 = options;
      do {
        this = (VideoTrack *)mkvparser::Tracks::GetTrackByIndex(local_110,uVar13);
        if (this != (VideoTrack *)0x0) {
          libwebm::Indent::Adjust(indent,2);
          pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length);
          fprintf((FILE *)o,"%sTrack:",local_e0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          if (options->output_offset == true) {
            fprintf((FILE *)o,"  @: %lld",(this->super_Track).m_element_start);
          }
          if (options->output_size == true) {
            fprintf((FILE *)o,"  size: %lld",(this->super_Track).m_element_size);
          }
          fputc(10,(FILE *)o);
          local_170 = (PrimaryChromaticity *)mkvparser::Track::GetType((Track *)this);
          lVar8 = mkvparser::Track::GetNumber((Track *)this);
          p_Var9 = (_anonymous_namespace_ *)mkvparser::Track::GetNameAsUTF8((Track *)this);
          (anonymous_namespace)::UTF8ToWideString_abi_cxx11_(&local_e0,p_Var9,str);
          libwebm::Indent::Adjust(indent,2);
          pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length);
          fprintf((FILE *)o,"%sTrackType   : %ld\n",local_150._M_dataplus._M_p,local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length);
          fprintf((FILE *)o,"%sTrackNumber : %ld\n",local_150._M_dataplus._M_p,lVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          if (local_e0._M_string_length != 0) {
            pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length);
            fprintf((FILE *)o,"%sName        : %ls\n",local_150._M_dataplus._M_p,
                    local_e0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p);
            }
          }
          pcVar10 = mkvparser::Track::GetCodecId((Track *)this);
          if (pcVar10 != (char *)0x0) {
            pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length);
            fprintf((FILE *)o,"%sCodecID     : %s\n",local_150._M_dataplus._M_p,pcVar10);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p);
            }
          }
          p_Var9 = (_anonymous_namespace_ *)mkvparser::Track::GetCodecNameAsUTF8((Track *)this);
          (anonymous_namespace)::UTF8ToWideString_abi_cxx11_(&local_150,p_Var9,str_00);
          if (local_150._M_string_length != 0) {
            pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
            local_190 = local_180;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_190,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length);
            fprintf((FILE *)o,"%sCodecName   : %ls\n",local_190,local_150._M_dataplus._M_p);
            if (local_190 != local_180) {
              operator_delete(local_190);
            }
          }
          private_data = mkvparser::Track::GetCodecPrivate((Track *)this,(size_t *)local_90);
          local_e4 = uVar21;
          if (private_data == (uchar *)0x0) {
LAB_00117a13:
            uVar12 = mkvparser::Track::GetDefaultDuration((Track *)this);
            if (uVar12 != 0) {
              pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
              local_190 = local_180;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_190,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length
                        );
              fprintf((FILE *)o,"%sDefaultDuration: %lu\n",local_190,uVar12);
              if (local_190 != local_180) {
                operator_delete(local_190);
              }
            }
            uVar13 = mkvparser::Track::GetContentEncodingCount((Track *)this);
            if (uVar13 != 0) {
              this_00 = mkvparser::Track::GetContentEncodingByIndex((Track *)this,0);
              if (this_00 == (ContentEncoding *)0x0) {
                pcVar10 = "Could not get first ContentEncoding.";
LAB_00118e09:
                puts(pcVar10);
                goto LAB_00118e0e;
              }
              pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
              local_190 = local_180;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_190,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length
                        );
              fprintf((FILE *)o,"%sContentEncodingOrder : %lld\n",local_190,this_00->encoding_order_
                     );
              if (local_190 != local_180) {
                operator_delete(local_190);
              }
              pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
              local_190 = local_180;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_190,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length
                        );
              fprintf((FILE *)o,"%sContentEncodingScope : %lld\n",local_190,this_00->encoding_scope_
                     );
              if (local_190 != local_180) {
                operator_delete(local_190);
              }
              pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
              local_190 = local_180;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_190,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length
                        );
              fprintf((FILE *)o,"%sContentEncodingType  : %lld\n",local_190,this_00->encoding_type_)
              ;
              if (local_190 != local_180) {
                operator_delete(local_190);
              }
              uVar13 = mkvparser::ContentEncoding::GetEncryptionCount(this_00);
              if (uVar13 != 0) {
                pCVar14 = mkvparser::ContentEncoding::GetEncryptionByIndex(this_00,0);
                if (pCVar14 == (ContentEncryption *)0x0) {
                  pcVar10 = "Could not get first ContentEncryption.";
                  goto LAB_00118e09;
                }
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_190 = local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_190,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sContentEncAlgo       : %lld\n",local_190,pCVar14->algo);
                if (local_190 != local_180) {
                  operator_delete(local_190);
                }
                if (0 < pCVar14->key_id_len) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sContentEncKeyID      : ",local_190);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                  if (0 < pCVar14->key_id_len) {
                    lVar8 = 0;
                    do {
                      fprintf((FILE *)o,"0x%02x, ",(ulong)pCVar14->key_id[lVar8]);
                      lVar8 = lVar8 + 1;
                    } while (lVar8 < pCVar14->key_id_len);
                  }
                  fputc(10,(FILE *)o);
                }
                if (0 < pCVar14->signature_len) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sContentSignature     : 0x",local_190);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                  if (0 < pCVar14->signature_len) {
                    lVar8 = 0;
                    do {
                      fprintf((FILE *)o,"%x",(ulong)pCVar14->signature[lVar8]);
                      lVar8 = lVar8 + 1;
                    } while (lVar8 < pCVar14->signature_len);
                  }
                  fputc(10,(FILE *)o);
                }
                if (0 < pCVar14->sig_key_id_len) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sContentSigKeyID      : 0x",local_190);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                  if (0 < pCVar14->sig_key_id_len) {
                    lVar8 = 0;
                    do {
                      fprintf((FILE *)o,"%x",(ulong)pCVar14->sig_key_id[lVar8]);
                      lVar8 = lVar8 + 1;
                    } while (lVar8 < pCVar14->sig_key_id_len);
                  }
                  fputc(10,(FILE *)o);
                }
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_190 = local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_190,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sContentSigAlgo       : %lld\n",local_190,pCVar14->sig_algo);
                if (local_190 != local_180) {
                  operator_delete(local_190);
                }
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_190 = local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_190,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sContentSigHashAlgo   : %lld\n",local_190,pCVar14->sig_hash_algo
                       );
                if (local_190 != local_180) {
                  operator_delete(local_190);
                }
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_190 = local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_190,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sCipherMode           : %lld\n",local_190,
                        (pCVar14->aes_settings).cipher_mode);
                if (local_190 != local_180) {
                  operator_delete(local_190);
                }
              }
            }
            if (local_170 == (PrimaryChromaticity *)0x2) {
              lVar17 = mkvparser::AudioTrack::GetChannels((AudioTrack *)this);
              lVar20 = mkvparser::AudioTrack::GetBitDepth((AudioTrack *)this);
              local_170 = (PrimaryChromaticity *)mkvparser::Track::GetCodecDelay((Track *)this);
              uVar12 = mkvparser::Track::GetSeekPreRoll((Track *)this);
              pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
              local_190 = local_180;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_190,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length
                        );
              fprintf((FILE *)o,"%sChannels         : %ld\n",local_190,lVar17);
              if (local_190 != local_180) {
                operator_delete(local_190);
              }
              if (0 < lVar20) {
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_190 = local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_190,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sBitDepth         : %ld\n",local_190,lVar20);
                if (local_190 != local_180) {
                  operator_delete(local_190);
                }
              }
              local_190 = local_180;
              pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_190,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length
                        );
              puVar4 = local_190;
              mkvparser::AudioTrack::GetSamplingRate((AudioTrack *)this);
              fprintf((FILE *)o,"%sSamplingFrequency: %g\n",puVar4);
              if (local_190 != local_180) {
                operator_delete(local_190);
              }
              pPVar15 = local_170;
              if (local_170 != (PrimaryChromaticity *)0x0) {
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_190 = local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_190,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sCodecDelay       : %lu\n",local_190,pPVar15);
                if (local_190 != local_180) {
                  operator_delete(local_190);
                }
              }
              if (uVar12 != 0) {
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_190 = local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_190,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sSeekPreRoll      : %lu\n",local_190,uVar12);
                if (local_190 != local_180) {
                  operator_delete(local_190);
                }
              }
            }
            else if (local_170 == (PrimaryChromaticity *)0x1) {
              local_170 = (PrimaryChromaticity *)mkvparser::VideoTrack::GetWidth(this);
              pPVar15 = (PrimaryChromaticity *)mkvparser::VideoTrack::GetHeight(this);
              pPVar16 = (PrimaryChromaticity *)mkvparser::VideoTrack::GetDisplayWidth(this);
              local_168 = (PrimaryChromaticity *)mkvparser::VideoTrack::GetDisplayHeight(this);
              lVar17 = mkvparser::VideoTrack::GetDisplayUnit(this);
              local_158 = (PrimaryChromaticity *)mkvparser::VideoTrack::GetFrameRate(this);
              pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
              local_190 = local_180;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_190,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length
                        );
              fprintf((FILE *)o,"%sPixelWidth  : %ld\n",local_190,local_170);
              if (local_190 != local_180) {
                operator_delete(local_190);
              }
              pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
              local_190 = local_180;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_190,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length
                        );
              fprintf((FILE *)o,"%sPixelHeight : %ld\n",local_190,pPVar15);
              if (local_190 != local_180) {
                operator_delete(local_190);
              }
              if (0.0 < (double)local_158) {
                local_190 = local_180;
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_190,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                puVar4 = local_190;
                mkvparser::VideoTrack::GetFrameRate(this);
                fprintf((FILE *)o,"%sFrameRate   : %g\n",puVar4);
                if (local_190 != local_180) {
                  operator_delete(local_190);
                }
              }
              pPVar5 = local_168;
              if (((local_168 != pPVar15) || (pPVar16 != local_170)) || (0 < lVar17)) {
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_190 = local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_190,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sDisplayWidth  : %ld\n",local_190,pPVar16);
                if (local_190 != local_180) {
                  operator_delete(local_190);
                }
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_190 = local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_190,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sDisplayHeight : %ld\n",local_190,pPVar5);
                if (local_190 != local_180) {
                  operator_delete(local_190);
                }
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_190 = local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_190,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sDisplayUnit   : %ld\n",local_190,lVar17);
                if (local_190 != local_180) {
                  operator_delete(local_190);
                }
              }
              pCVar18 = mkvparser::VideoTrack::GetColour(this);
              if (pCVar18 != (Colour *)0x0) {
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_190 = local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_190,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sColour:\n",local_190);
                if (local_190 != local_180) {
                  operator_delete(local_190);
                }
                libwebm::Indent::Adjust(indent,2);
                pPVar15 = (PrimaryChromaticity *)pCVar18->matrix_coefficients;
                pPVar16 = (PrimaryChromaticity *)pCVar18->bits_per_channel;
                local_170 = (PrimaryChromaticity *)pCVar18->chroma_subsampling_horz;
                local_60 = (PrimaryChromaticity *)pCVar18->chroma_subsampling_vert;
                local_168 = (PrimaryChromaticity *)pCVar18->cb_subsampling_horz;
                local_158 = (PrimaryChromaticity *)pCVar18->cb_subsampling_vert;
                local_118 = (PrimaryChromaticity *)pCVar18->chroma_siting_horz;
                local_a0 = (PrimaryChromaticity *)pCVar18->chroma_siting_vert;
                local_a8 = (PrimaryChromaticity *)pCVar18->range;
                local_b0 = (PrimaryChromaticity *)pCVar18->transfer_characteristics;
                local_b8 = (PrimaryChromaticity *)pCVar18->primaries;
                local_c0 = (PrimaryChromaticity *)pCVar18->max_cll;
                local_68 = (PrimaryChromaticity *)pCVar18->max_fall;
                if (pPVar15 != local_98) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sMatrixCoefficients      : %ld\n",local_190,pPVar15);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                pPVar15 = local_98;
                if (pPVar16 != local_98) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sBitsPerChannel          : %ld\n",local_190,pPVar16);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                pPVar16 = local_60;
                if (local_170 != pPVar15) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sChromaSubsamplingHorz   : %ld\n",local_190,local_170);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                if (pPVar16 != pPVar15) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sChromaSubsamplingVert   : %ld\n",local_190,pPVar16);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                if (local_168 != pPVar15) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sCbSubsamplingHorz       : %ld\n",local_190,local_168);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                if (local_158 != pPVar15) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sCbSubsamplingVert       : %ld\n",local_190,local_158);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                if (local_118 != pPVar15) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sChromaSitingHorz        : %ld\n",local_190,local_118);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                if (local_a0 != pPVar15) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sChromaSitingVert        : %ld\n",local_190,local_a0);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                if (local_a8 != pPVar15) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sRange                   : %ld\n",local_190,local_a8);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                if (local_b0 != pPVar15) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sTransferCharacteristics : %ld\n",local_190,local_b0);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                if (local_b8 != pPVar15) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sPrimaries               : %ld\n",local_190,local_b8);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                if (local_c0 != pPVar15) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sMaxCLL                  : %ld\n",local_190,local_c0);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                pPVar16 = local_68;
                if (local_68 != pPVar15) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sMaxFALL                 : %ld\n",local_190,pPVar16);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                pMVar3 = pCVar18->mastering_metadata;
                if (pMVar3 != (MasteringMetadata *)0x0) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sMasteringMetadata:\n",local_190);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                  libwebm::Indent::Adjust(indent,2);
                  pPVar15 = pMVar3->r;
                  pPVar16 = pMVar3->g;
                  local_118 = pMVar3->b;
                  local_158 = pMVar3->white_point;
                  local_170 = (PrimaryChromaticity *)CONCAT44(local_170._4_4_,pMVar3->luminance_max)
                  ;
                  local_168 = (PrimaryChromaticity *)CONCAT44(local_168._4_4_,pMVar3->luminance_min)
                  ;
                  if (pPVar15 != (PrimaryChromaticity *)0x0) {
                    pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                    local_190 = local_180;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_190,pcVar2,
                               pcVar2 + (indent->indent_str_)._M_string_length);
                    fprintf((FILE *)o,"%sPrimaryRChromaticityX   : %g\n",(double)pPVar15->x,
                            local_190);
                    if (local_190 != local_180) {
                      operator_delete(local_190);
                    }
                    pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                    local_190 = local_180;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_190,pcVar2,
                               pcVar2 + (indent->indent_str_)._M_string_length);
                    fprintf((FILE *)o,"%sPrimaryRChromaticityY   : %g\n",(double)pPVar15->y,
                            local_190);
                    if (local_190 != local_180) {
                      operator_delete(local_190);
                    }
                  }
                  if (pPVar16 != (PrimaryChromaticity *)0x0) {
                    pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                    local_190 = local_180;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_190,pcVar2,
                               pcVar2 + (indent->indent_str_)._M_string_length);
                    fprintf((FILE *)o,"%sPrimaryGChromaticityX   : %g\n",(double)pPVar16->x,
                            local_190);
                    if (local_190 != local_180) {
                      operator_delete(local_190);
                    }
                    pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                    local_190 = local_180;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_190,pcVar2,
                               pcVar2 + (indent->indent_str_)._M_string_length);
                    fprintf((FILE *)o,"%sPrimaryGChromaticityY   : %g\n",(double)pPVar16->y,
                            local_190);
                    if (local_190 != local_180) {
                      operator_delete(local_190);
                    }
                  }
                  pPVar16 = local_118;
                  pPVar15 = local_158;
                  if (local_118 != (PrimaryChromaticity *)0x0) {
                    pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                    local_190 = local_180;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_190,pcVar2,
                               pcVar2 + (indent->indent_str_)._M_string_length);
                    fprintf((FILE *)o,"%sPrimaryBChromaticityX   : %g\n",(double)pPVar16->x,
                            local_190);
                    if (local_190 != local_180) {
                      operator_delete(local_190);
                    }
                    pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                    local_190 = local_180;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_190,pcVar2,
                               pcVar2 + (indent->indent_str_)._M_string_length);
                    fprintf((FILE *)o,"%sPrimaryBChromaticityY   : %g\n",(double)pPVar16->y,
                            local_190);
                    if (local_190 != local_180) {
                      operator_delete(local_190);
                    }
                  }
                  if (pPVar15 != (PrimaryChromaticity *)0x0) {
                    pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                    local_190 = local_180;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_190,pcVar2,
                               pcVar2 + (indent->indent_str_)._M_string_length);
                    fprintf((FILE *)o,"%sWhitePointChromaticityX : %g\n",(double)pPVar15->x,
                            local_190);
                    if (local_190 != local_180) {
                      operator_delete(local_190);
                    }
                    pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                    local_190 = local_180;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_190,pcVar2,
                               pcVar2 + (indent->indent_str_)._M_string_length);
                    fprintf((FILE *)o,"%sWhitePointChromaticityY : %g\n",(double)pPVar15->y,
                            local_190);
                    if (local_190 != local_180) {
                      operator_delete(local_190);
                    }
                  }
                  if ((local_170._0_4_ != local_12c) || (NAN(local_170._0_4_) || NAN(local_12c))) {
                    pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                    local_190 = local_180;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_190,pcVar2,
                               pcVar2 + (indent->indent_str_)._M_string_length);
                    fprintf((FILE *)o,"%sLuminanceMax            : %g\n",(double)local_170._0_4_,
                            local_190);
                    if (local_190 != local_180) {
                      operator_delete(local_190);
                    }
                  }
                  if ((local_168._0_4_ != local_12c) || (NAN(local_168._0_4_) || NAN(local_12c))) {
                    pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                    local_190 = local_180;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_190,pcVar2,
                               pcVar2 + (indent->indent_str_)._M_string_length);
                    fprintf((FILE *)o,"%sLuminanceMin            : %g\n",(double)local_168._0_4_,
                            local_190);
                    if (local_190 != local_180) {
                      operator_delete(local_190);
                    }
                  }
                  libwebm::Indent::Adjust(indent,-2);
                }
                libwebm::Indent::Adjust(indent,-2);
              }
              pPVar19 = mkvparser::VideoTrack::GetProjection(this);
              if (pPVar19 != (Projection *)0x0) {
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_190 = local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_190,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sProjection:\n",local_190);
                if (local_190 != local_180) {
                  operator_delete(local_190);
                }
                libwebm::Indent::Adjust(indent,2);
                PVar1 = pPVar19->type;
                if (PVar1 != kTypeNotPresent) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sProjectionType            : %d\n",local_190,
                          (ulong)(uint)PVar1);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                if (pPVar19->private_data != (uchar *)0x0) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sProjectionPrivate(size)   : %d\n",local_190,
                          (ulong)(uint)pPVar19->private_data_length);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                if ((pPVar19->pose_yaw != local_15c) || (NAN(pPVar19->pose_yaw) || NAN(local_15c)))
                {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sProjectionPoseYaw         : %g\n",(double)pPVar19->pose_yaw,
                          local_190);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                if ((pPVar19->pose_pitch != local_15c) ||
                   (NAN(pPVar19->pose_pitch) || NAN(local_15c))) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sProjectionPosePitch       : %g\n",(double)pPVar19->pose_pitch
                          ,local_190);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                if ((pPVar19->pose_roll != local_15c) || (NAN(pPVar19->pose_roll) || NAN(local_15c))
                   ) {
                  pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,pcVar2,
                             pcVar2 + (indent->indent_str_)._M_string_length);
                  fprintf((FILE *)o,"%sProjectionPoseRoll         : %g\n",(double)pPVar19->pose_roll
                          ,local_190);
                  if (local_190 != local_180) {
                    operator_delete(local_190);
                  }
                }
                libwebm::Indent::Adjust(indent,-2);
              }
            }
            bVar6 = true;
            libwebm::Indent::Adjust(indent,-4);
          }
          else {
            pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
            local_190 = local_180;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_190,pcVar2,pcVar2 + (indent->indent_str_)._M_string_length);
            fprintf((FILE *)o,"%sPrivateData(size): %d\n",local_190,(ulong)local_90[0]);
            if (local_190 != local_180) {
              operator_delete(local_190);
            }
            if (local_170 != (PrimaryChromaticity *)0x1) goto LAB_00117a13;
            pcVar10 = mkvparser::Track::GetCodecId((Track *)this);
            if (pcVar10 == (char *)0x0) {
              pcVar10 = "";
            }
            local_190 = local_180;
            sVar11 = strlen(pcVar10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_190,pcVar10,pcVar10 + sVar11);
            local_88 = local_78;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"V_VP9","");
            if ((local_188 != local_80) ||
               ((local_188 != 0 && (iVar7 = bcmp(local_190,local_88,local_188), iVar7 != 0)))) {
LAB_001179e5:
              if (local_88 != local_78) {
                operator_delete(local_88);
              }
              if (local_190 != local_180) {
                operator_delete(local_190);
              }
              goto LAB_00117a13;
            }
            local_128._0_8_ = CONCAT44(uStack_44,local_48);
            local_128._8_8_ = CONCAT44(uStack_3c,uStack_40);
            bVar6 = libwebm::ParseVpxCodecPrivate(private_data,local_90[0],&local_128);
            if (bVar6) {
              if (local_128.profile != -1) {
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_108[0] = local_f8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_108,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sVP9 profile            : %d\n",local_108[0],
                        local_128._0_8_ & 0xffffffff);
                if (local_108[0] != local_f8) {
                  operator_delete(local_108[0]);
                }
              }
              if (local_128.level != -1) {
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_108[0] = local_f8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_108,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sVP9 level              : %d\n",local_108[0],
                        (ulong)local_128._0_8_ >> 0x20);
                if (local_108[0] != local_f8) {
                  operator_delete(local_108[0]);
                }
              }
              if (local_128.bit_depth != -1) {
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_108[0] = local_f8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_108,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sVP9 bit_depth          : %d\n",local_108[0],
                        local_128._8_8_ & 0xffffffff);
                if (local_108[0] != local_f8) {
                  operator_delete(local_108[0]);
                }
              }
              if (local_128.chroma_subsampling != -1) {
                pcVar2 = (indent->indent_str_)._M_dataplus._M_p;
                local_108[0] = local_f8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_108,pcVar2,
                           pcVar2 + (indent->indent_str_)._M_string_length);
                fprintf((FILE *)o,"%sVP9 chroma subsampling : %d\n",local_108[0],
                        (ulong)local_128._8_8_ >> 0x20);
                if (local_108[0] != local_f8) {
                  operator_delete(local_108[0]);
                }
              }
              goto LAB_001179e5;
            }
            fwrite("Error parsing VpxCodecPrivate.\n",0x1f,1,_stderr);
            if (local_88 != local_78) {
              operator_delete(local_88);
            }
            if (local_190 != local_180) {
              operator_delete(local_190);
            }
LAB_00118e0e:
            bVar6 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          options = local_58;
          uVar21 = local_e4;
          if (!bVar6) goto LAB_00118ec6;
        }
        uVar21 = uVar21 + 1;
        uVar13 = (unsigned_long)uVar21;
      } while (local_50 != uVar13);
    }
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool OutputTracks(const mkvparser::Segment& segment, const Options& options,
                  FILE* o, Indent* indent) {
  const mkvparser::Tracks* const tracks = segment.GetTracks();
  if (!tracks) {
    fprintf(stderr, "Tracks was NULL.\n");
    return false;
  }

  fprintf(o, "%sTracks:", indent->indent_str().c_str());
  if (options.output_offset)
    fprintf(o, "  @: %lld", tracks->m_element_start);
  if (options.output_size)
    fprintf(o, "  size: %lld", tracks->m_element_size);
  fprintf(o, "\n");

  unsigned int i = 0;
  const unsigned long j = tracks->GetTracksCount();
  while (i != j) {
    const mkvparser::Track* const track = tracks->GetTrackByIndex(i++);
    if (track == NULL)
      continue;

    indent->Adjust(libwebm::kIncreaseIndent);
    fprintf(o, "%sTrack:", indent->indent_str().c_str());
    if (options.output_offset)
      fprintf(o, "  @: %lld", track->m_element_start);
    if (options.output_size)
      fprintf(o, "  size: %lld", track->m_element_size);
    fprintf(o, "\n");

    const int64_t track_type = track->GetType();
    const int64_t track_number = track->GetNumber();
    const wstring track_name = UTF8ToWideString(track->GetNameAsUTF8());

    indent->Adjust(libwebm::kIncreaseIndent);
    fprintf(o, "%sTrackType   : %" PRId64 "\n", indent->indent_str().c_str(),
            track_type);
    fprintf(o, "%sTrackNumber : %" PRId64 "\n", indent->indent_str().c_str(),
            track_number);
    if (!track_name.empty())
      fprintf(o, "%sName        : %ls\n", indent->indent_str().c_str(),
              track_name.c_str());

    const char* const codec_id = track->GetCodecId();
    if (codec_id)
      fprintf(o, "%sCodecID     : %s\n", indent->indent_str().c_str(),
              codec_id);

    const wstring codec_name = UTF8ToWideString(track->GetCodecNameAsUTF8());
    if (!codec_name.empty())
      fprintf(o, "%sCodecName   : %ls\n", indent->indent_str().c_str(),
              codec_name.c_str());

    size_t private_size;
    const unsigned char* const private_data =
        track->GetCodecPrivate(private_size);
    if (private_data) {
      fprintf(o, "%sPrivateData(size): %d\n", indent->indent_str().c_str(),
              static_cast<int>(private_size));

      if (track_type == mkvparser::Track::kVideo) {
        const std::string codec_id = ToString(track->GetCodecId());
        const std::string v_vp9 = "V_VP9";
        if (codec_id == v_vp9) {
          libwebm::Vp9CodecFeatures features;
          if (!libwebm::ParseVpxCodecPrivate(private_data,
                                             static_cast<int32_t>(private_size),
                                             &features)) {
            fprintf(stderr, "Error parsing VpxCodecPrivate.\n");
            return false;
          }
          if (features.profile != -1)
            fprintf(o, "%sVP9 profile            : %d\n",
                    indent->indent_str().c_str(), features.profile);
          if (features.level != -1)
            fprintf(o, "%sVP9 level              : %d\n",
                    indent->indent_str().c_str(), features.level);
          if (features.bit_depth != -1)
            fprintf(o, "%sVP9 bit_depth          : %d\n",
                    indent->indent_str().c_str(), features.bit_depth);
          if (features.chroma_subsampling != -1)
            fprintf(o, "%sVP9 chroma subsampling : %d\n",
                    indent->indent_str().c_str(), features.chroma_subsampling);
        }
      }
    }

    const uint64_t default_duration = track->GetDefaultDuration();
    if (default_duration > 0)
      fprintf(o, "%sDefaultDuration: %" PRIu64 "\n",
              indent->indent_str().c_str(), default_duration);

    if (track->GetContentEncodingCount() > 0) {
      // Only check the first content encoding.
      const ContentEncoding* const encoding =
          track->GetContentEncodingByIndex(0);
      if (!encoding) {
        printf("Could not get first ContentEncoding.\n");
        return false;
      }

      fprintf(o, "%sContentEncodingOrder : %lld\n",
              indent->indent_str().c_str(), encoding->encoding_order());
      fprintf(o, "%sContentEncodingScope : %lld\n",
              indent->indent_str().c_str(), encoding->encoding_scope());
      fprintf(o, "%sContentEncodingType  : %lld\n",
              indent->indent_str().c_str(), encoding->encoding_type());

      if (encoding->GetEncryptionCount() > 0) {
        // Only check the first encryption.
        const ContentEncoding::ContentEncryption* const encryption =
            encoding->GetEncryptionByIndex(0);
        if (!encryption) {
          printf("Could not get first ContentEncryption.\n");
          return false;
        }

        fprintf(o, "%sContentEncAlgo       : %lld\n",
                indent->indent_str().c_str(), encryption->algo);

        if (encryption->key_id_len > 0) {
          fprintf(o, "%sContentEncKeyID      : ", indent->indent_str().c_str());
          for (int k = 0; k < encryption->key_id_len; ++k) {
            fprintf(o, "0x%02x, ", encryption->key_id[k]);
          }
          fprintf(o, "\n");
        }

        if (encryption->signature_len > 0) {
          fprintf(o, "%sContentSignature     : 0x",
                  indent->indent_str().c_str());
          for (int k = 0; k < encryption->signature_len; ++k) {
            fprintf(o, "%x", encryption->signature[k]);
          }
          fprintf(o, "\n");
        }

        if (encryption->sig_key_id_len > 0) {
          fprintf(o, "%sContentSigKeyID      : 0x",
                  indent->indent_str().c_str());
          for (int k = 0; k < encryption->sig_key_id_len; ++k) {
            fprintf(o, "%x", encryption->sig_key_id[k]);
          }
          fprintf(o, "\n");
        }

        fprintf(o, "%sContentSigAlgo       : %lld\n",
                indent->indent_str().c_str(), encryption->sig_algo);
        fprintf(o, "%sContentSigHashAlgo   : %lld\n",
                indent->indent_str().c_str(), encryption->sig_hash_algo);

        const ContentEncoding::ContentEncAESSettings& aes =
            encryption->aes_settings;
        fprintf(o, "%sCipherMode           : %lld\n",
                indent->indent_str().c_str(), aes.cipher_mode);
      }
    }

    if (track_type == mkvparser::Track::kVideo) {
      const mkvparser::VideoTrack* const video_track =
          static_cast<const mkvparser::VideoTrack*>(track);
      const int64_t width = video_track->GetWidth();
      const int64_t height = video_track->GetHeight();
      const int64_t display_width = video_track->GetDisplayWidth();
      const int64_t display_height = video_track->GetDisplayHeight();
      const int64_t display_unit = video_track->GetDisplayUnit();
      const double frame_rate = video_track->GetFrameRate();
      fprintf(o, "%sPixelWidth  : %" PRId64 "\n", indent->indent_str().c_str(),
              width);
      fprintf(o, "%sPixelHeight : %" PRId64 "\n", indent->indent_str().c_str(),
              height);
      if (frame_rate > 0.0)
        fprintf(o, "%sFrameRate   : %g\n", indent->indent_str().c_str(),
                video_track->GetFrameRate());
      if (display_unit > 0 || display_width != width ||
          display_height != height) {
        fprintf(o, "%sDisplayWidth  : %" PRId64 "\n",
                indent->indent_str().c_str(), display_width);
        fprintf(o, "%sDisplayHeight : %" PRId64 "\n",
                indent->indent_str().c_str(), display_height);
        fprintf(o, "%sDisplayUnit   : %" PRId64 "\n",
                indent->indent_str().c_str(), display_unit);
      }

      const mkvparser::Colour* const colour = video_track->GetColour();
      if (colour) {
        // TODO(fgalligan): Add support for Colour's address and size.
        fprintf(o, "%sColour:\n", indent->indent_str().c_str());
        indent->Adjust(libwebm::kIncreaseIndent);

        const int64_t matrix_coefficients = colour->matrix_coefficients;
        const int64_t bits_per_channel = colour->bits_per_channel;
        const int64_t chroma_subsampling_horz = colour->chroma_subsampling_horz;
        const int64_t chroma_subsampling_vert = colour->chroma_subsampling_vert;
        const int64_t cb_subsampling_horz = colour->cb_subsampling_horz;
        const int64_t cb_subsampling_vert = colour->cb_subsampling_vert;
        const int64_t chroma_siting_horz = colour->chroma_siting_horz;
        const int64_t chroma_siting_vert = colour->chroma_siting_vert;
        const int64_t range = colour->range;
        const int64_t transfer_characteristics =
            colour->transfer_characteristics;
        const int64_t primaries = colour->primaries;
        const int64_t max_cll = colour->max_cll;
        const int64_t max_fall = colour->max_fall;
        if (matrix_coefficients != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sMatrixCoefficients      : %" PRId64 "\n",
                  indent->indent_str().c_str(), matrix_coefficients);
        if (bits_per_channel != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sBitsPerChannel          : %" PRId64 "\n",
                  indent->indent_str().c_str(), bits_per_channel);
        if (chroma_subsampling_horz != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sChromaSubsamplingHorz   : %" PRId64 "\n",
                  indent->indent_str().c_str(), chroma_subsampling_horz);
        if (chroma_subsampling_vert != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sChromaSubsamplingVert   : %" PRId64 "\n",
                  indent->indent_str().c_str(), chroma_subsampling_vert);
        if (cb_subsampling_horz != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sCbSubsamplingHorz       : %" PRId64 "\n",
                  indent->indent_str().c_str(), cb_subsampling_horz);
        if (cb_subsampling_vert != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sCbSubsamplingVert       : %" PRId64 "\n",
                  indent->indent_str().c_str(), cb_subsampling_vert);
        if (chroma_siting_horz != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sChromaSitingHorz        : %" PRId64 "\n",
                  indent->indent_str().c_str(), chroma_siting_horz);
        if (chroma_siting_vert != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sChromaSitingVert        : %" PRId64 "\n",
                  indent->indent_str().c_str(), chroma_siting_vert);
        if (range != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sRange                   : %" PRId64 "\n",
                  indent->indent_str().c_str(), range);
        if (transfer_characteristics != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sTransferCharacteristics : %" PRId64 "\n",
                  indent->indent_str().c_str(), transfer_characteristics);
        if (primaries != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sPrimaries               : %" PRId64 "\n",
                  indent->indent_str().c_str(), primaries);
        if (max_cll != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sMaxCLL                  : %" PRId64 "\n",
                  indent->indent_str().c_str(), max_cll);
        if (max_fall != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sMaxFALL                 : %" PRId64 "\n",
                  indent->indent_str().c_str(), max_fall);

        const mkvparser::MasteringMetadata* const metadata =
            colour->mastering_metadata;
        if (metadata) {
          // TODO(fgalligan): Add support for MasteringMetadata's address and
          // size.
          fprintf(o, "%sMasteringMetadata:\n", indent->indent_str().c_str());
          indent->Adjust(libwebm::kIncreaseIndent);

          const mkvparser::PrimaryChromaticity* const red = metadata->r;
          const mkvparser::PrimaryChromaticity* const green = metadata->g;
          const mkvparser::PrimaryChromaticity* const blue = metadata->b;
          const mkvparser::PrimaryChromaticity* const white =
              metadata->white_point;
          const float max = metadata->luminance_max;
          const float min = metadata->luminance_min;
          if (red) {
            fprintf(o, "%sPrimaryRChromaticityX   : %g\n",
                    indent->indent_str().c_str(), red->x);
            fprintf(o, "%sPrimaryRChromaticityY   : %g\n",
                    indent->indent_str().c_str(), red->y);
          }
          if (green) {
            fprintf(o, "%sPrimaryGChromaticityX   : %g\n",
                    indent->indent_str().c_str(), green->x);
            fprintf(o, "%sPrimaryGChromaticityY   : %g\n",
                    indent->indent_str().c_str(), green->y);
          }
          if (blue) {
            fprintf(o, "%sPrimaryBChromaticityX   : %g\n",
                    indent->indent_str().c_str(), blue->x);
            fprintf(o, "%sPrimaryBChromaticityY   : %g\n",
                    indent->indent_str().c_str(), blue->y);
          }
          if (white) {
            fprintf(o, "%sWhitePointChromaticityX : %g\n",
                    indent->indent_str().c_str(), white->x);
            fprintf(o, "%sWhitePointChromaticityY : %g\n",
                    indent->indent_str().c_str(), white->y);
          }
          if (max != mkvparser::MasteringMetadata::kValueNotPresent)
            fprintf(o, "%sLuminanceMax            : %g\n",
                    indent->indent_str().c_str(), max);
          if (min != mkvparser::MasteringMetadata::kValueNotPresent)
            fprintf(o, "%sLuminanceMin            : %g\n",
                    indent->indent_str().c_str(), min);
          indent->Adjust(libwebm::kDecreaseIndent);
        }
        indent->Adjust(libwebm::kDecreaseIndent);
      }

      const mkvparser::Projection* const projection =
          video_track->GetProjection();
      if (projection) {
        fprintf(o, "%sProjection:\n", indent->indent_str().c_str());
        indent->Adjust(libwebm::kIncreaseIndent);

        const int projection_type = static_cast<int>(projection->type);
        const int kTypeNotPresent =
            static_cast<int>(mkvparser::Projection::kTypeNotPresent);
        const float kValueNotPresent = mkvparser::Projection::kValueNotPresent;
        if (projection_type != kTypeNotPresent)
          fprintf(o, "%sProjectionType            : %d\n",
                  indent->indent_str().c_str(), projection_type);
        if (projection->private_data)
          fprintf(o, "%sProjectionPrivate(size)   : %d\n",
                  indent->indent_str().c_str(),
                  static_cast<int>(projection->private_data_length));
        if (projection->pose_yaw != kValueNotPresent)
          fprintf(o, "%sProjectionPoseYaw         : %g\n",
                  indent->indent_str().c_str(), projection->pose_yaw);
        if (projection->pose_pitch != kValueNotPresent)
          fprintf(o, "%sProjectionPosePitch       : %g\n",
                  indent->indent_str().c_str(), projection->pose_pitch);
        if (projection->pose_roll != kValueNotPresent)
          fprintf(o, "%sProjectionPoseRoll         : %g\n",
                  indent->indent_str().c_str(), projection->pose_roll);
        indent->Adjust(libwebm::kDecreaseIndent);
      }
    } else if (track_type == mkvparser::Track::kAudio) {
      const mkvparser::AudioTrack* const audio_track =
          static_cast<const mkvparser::AudioTrack*>(track);
      const int64_t channels = audio_track->GetChannels();
      const int64_t bit_depth = audio_track->GetBitDepth();
      const uint64_t codec_delay = audio_track->GetCodecDelay();
      const uint64_t seek_preroll = audio_track->GetSeekPreRoll();
      fprintf(o, "%sChannels         : %" PRId64 "\n",
              indent->indent_str().c_str(), channels);
      if (bit_depth > 0)
        fprintf(o, "%sBitDepth         : %" PRId64 "\n",
                indent->indent_str().c_str(), bit_depth);
      fprintf(o, "%sSamplingFrequency: %g\n", indent->indent_str().c_str(),
              audio_track->GetSamplingRate());
      if (codec_delay)
        fprintf(o, "%sCodecDelay       : %" PRIu64 "\n",
                indent->indent_str().c_str(), codec_delay);
      if (seek_preroll)
        fprintf(o, "%sSeekPreRoll      : %" PRIu64 "\n",
                indent->indent_str().c_str(), seek_preroll);
    }
    indent->Adjust(libwebm::kDecreaseIndent * 2);
  }

  return true;
}